

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

OutputWorker * logger::OutputWorker::GetInstance(void)

{
  int iVar1;
  pointer pOVar2;
  unique_ptr<logger::OutputWorker,_std::default_delete<logger::OutputWorker>_> *unaff_retaddr;
  anon_class_1_0_00000001 *in_stack_00000018;
  once_flag *in_stack_00000020;
  
  if (GetInstance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&GetInstance()::instance);
    if (iVar1 != 0) {
      __cxa_atexit(std::unique_ptr<logger::OutputWorker,_std::default_delete<logger::OutputWorker>_>
                   ::~unique_ptr,&GetInstance::instance,&__dso_handle);
      __cxa_guard_release(&GetInstance()::instance);
    }
  }
  std::call_once<logger::OutputWorker::GetInstance()::__0>(in_stack_00000020,in_stack_00000018);
  pOVar2 = std::unique_ptr<logger::OutputWorker,_std::default_delete<logger::OutputWorker>_>::get
                     (unaff_retaddr);
  return pOVar2;
}

Assistant:

OutputWorker& OutputWorker::GetInstance()
{
    // Fix crash on shutdown due to MSVCRT bug prior to version 2015
    static std::once_flag m_singletonFlag;
    static std::unique_ptr<OutputWorker> instance;

    std::call_once(m_singletonFlag, []()
    {
        instance.reset(new OutputWorker);
    });

    return *instance.get();
}